

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::GetPsbtOutput
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt_output *output,
          bool *is_find)

{
  allocator<unsigned_char> *this;
  wally_map_item *pwVar1;
  size_type sVar2;
  const_reference pvVar3;
  CfdException *pCVar4;
  uchar *__dest;
  uchar *puVar5;
  CfdException *except_1;
  string local_288;
  size_t local_268;
  size_t index_1;
  CfdException *except;
  string local_250;
  size_t local_230;
  size_t index;
  undefined1 local_210 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  undefined1 local_1e0 [8];
  Pubkey pk;
  undefined1 local_1c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_13a;
  allocator local_139;
  string local_138;
  CfdSourceLocation local_118;
  undefined1 local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  int local_98;
  undefined1 local_92;
  allocator local_91;
  string local_90;
  CfdSourceLocation local_60;
  byte local_41;
  undefined1 local_40 [7];
  bool has_key_1byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  bool *is_find_local;
  wally_psbt_output *output_local;
  ByteData *key_data_local;
  
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = is_find;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,key_data);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  local_41 = sVar2 == 1;
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  if (*pvVar3 == '\0') {
    if ((local_41 & 1) == 0) {
      local_60.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_60.filename = local_60.filename + 1;
      local_60.line = 0x5d4;
      local_60.funcname = "GetPsbtOutput";
      logger::warn<>(&local_60,"psbt invalid key format.");
      local_92 = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_90,"psbt invalid key format error.",&local_91)
      ;
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_90);
      local_92 = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (output->redeem_script_len != 0) {
      if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = '\x01';
      }
      ByteData::ByteData(__return_storage_ptr__,output->redeem_script,
                         (uint32_t)output->redeem_script_len);
      local_98 = 1;
      goto LAB_005a0b83;
    }
    if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      local_f9 = 1;
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_f8,key_data);
      ::std::operator+(&local_d8,"psbt target key ",&local_f8);
      ::std::operator+(&local_b8,&local_d8," not found error.");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_b8);
      local_f9 = 0;
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    if (*pvVar3 == '\x01') {
      if ((local_41 & 1) == 0) {
        local_118.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_118.filename = local_118.filename + 1;
        local_118.line = 0x5e4;
        local_118.funcname = "GetPsbtOutput";
        logger::warn<>(&local_118,"psbt invalid key format.");
        local_13a = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_138,"psbt invalid key format error.",&local_139);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_138);
        local_13a = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (output->witness_script_len != 0) {
        if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = '\x01';
        }
        ByteData::ByteData(__return_storage_ptr__,output->witness_script,
                           (uint32_t)output->witness_script_len);
        local_98 = 1;
        goto LAB_005a0b83;
      }
      if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ByteData::GetHex_abi_cxx11_(&local_1a0,key_data);
        ::std::operator+(&local_180,"psbt target key ",&local_1a0);
        ::std::operator+(&local_160,&local_180," not found error.");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_160);
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
      if (*pvVar3 != '\x02') {
        local_268 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_288,"output unknowns",(allocator *)((long)&except_1 + 7));
        FindPsbtMap(&output->unknowns,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,&local_288,
                    &local_268);
        ::std::__cxx11::string::~string((string *)&local_288);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&except_1 + 7));
        if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = '\x01';
        }
        pwVar1 = (output->unknowns).items;
        ByteData::ByteData(__return_storage_ptr__,pwVar1[local_268].value,
                           (uint32_t)pwVar1[local_268].value_len);
        local_98 = 1;
        goto LAB_005a0b83;
      }
      sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
      this = (allocator<unsigned_char> *)
             ((long)&pk.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
      ::std::allocator<unsigned_char>::allocator(this);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0,sVar2 - 1,this);
      ::std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&pk.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
      if (sVar2 != 0) {
        __dest = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
        puVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
        memcpy(__dest,puVar5 + 1,sVar2);
      }
      ByteData::ByteData((ByteData *)
                         &pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
      Pubkey::Pubkey((Pubkey *)local_1e0,
                     (ByteData *)
                     &pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      ByteData::~ByteData((ByteData *)
                          &pk_bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      Pubkey::GetData((ByteData *)&index,(Pubkey *)local_1e0);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210,
                         (ByteData *)&index);
      ByteData::~ByteData((ByteData *)&index);
      local_230 = 0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_250,"output bip32 pubkey",(allocator *)((long)&except + 7));
      FindPsbtMap(&output->keypaths,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210,&local_250,
                  &local_230);
      ::std::__cxx11::string::~string((string *)&local_250);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&except + 7));
      if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = '\x01';
      }
      pwVar1 = (output->keypaths).items;
      ByteData::ByteData(__return_storage_ptr__,pwVar1[local_230].value,
                         (uint32_t)pwVar1[local_230].value_len);
      local_98 = 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_210);
      Pubkey::~Pubkey((Pubkey *)local_1e0);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
      if (local_98 != 0) goto LAB_005a0b83;
    }
  }
  ByteData::ByteData(__return_storage_ptr__);
  local_98 = 1;
LAB_005a0b83:
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static ByteData GetPsbtOutput(
    const ByteData &key_data, struct wally_psbt_output *output,
    bool *is_find) {
  if (is_find != nullptr) *is_find = false;
  const auto key = key_data.GetBytes();
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtOutputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->redeem_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->redeem_script,
          static_cast<uint32_t>(output->redeem_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->witness_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->witness_script,
          static_cast<uint32_t>(output->witness_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&output->keypaths, pk_bytes, "output bip32 pubkey", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->keypaths.items[index].value,
          static_cast<uint32_t>(output->keypaths.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&output->unknowns, key, "output unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->unknowns.items[index].value,
          static_cast<uint32_t>(output->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}